

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall
duckdb::CollectionScanState::CollectionScanState(CollectionScanState *this,TableScanState *parent_p)

{
  this->row_groups = (RowGroupSegmentTree *)0x0;
  this->max_row = 0;
  this->max_row_group_row = 0;
  (this->column_scans).
  super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl = (ColumnScanState *)0x0;
  this->row_group = (RowGroup *)0x0;
  this->vector_index = 0;
  this->batch_index = 0;
  SelectionVector::SelectionVector(&this->valid_sel,0x800);
  RandomEngine::RandomEngine(&this->random,-1);
  this->parent = parent_p;
  return;
}

Assistant:

CollectionScanState::CollectionScanState(TableScanState &parent_p)
    : row_group(nullptr), vector_index(0), max_row_group_row(0), row_groups(nullptr), max_row(0), batch_index(0),
      valid_sel(STANDARD_VECTOR_SIZE), random(-1), parent(parent_p) {
}